

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::swapPayload(Value *this,Value *other)

{
  ushort uVar1;
  ValueHolder *in_RSI;
  ValueHolder *in_RDI;
  int temp2;
  ValueType temp;
  
  uVar1 = *(ushort *)(in_RDI + 1);
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xff00 | *(ushort *)(in_RSI + 1) & 0xff;
  *(ushort *)(in_RSI + 1) = *(ushort *)(in_RSI + 1) & 0xff00 | uVar1 & 0xff;
  std::swap<Json::Value::ValueHolder>(in_RDI,in_RSI);
  uVar1 = *(ushort *)(in_RDI + 1);
  *(ushort *)(in_RDI + 1) =
       *(ushort *)(in_RDI + 1) & 0xfeff | (*(ushort *)(in_RSI + 1) >> 8 & 1) << 8;
  *(ushort *)(in_RSI + 1) = *(ushort *)(in_RSI + 1) & 0xfeff | (uVar1 >> 8 & 1) << 8;
  return;
}

Assistant:

void Value::swapPayload(Value& other) {
  ValueType temp = type_;
  type_ = other.type_;
  other.type_ = temp;
  std::swap(value_, other.value_);
  int temp2 = allocated_;
  allocated_ = other.allocated_;
  other.allocated_ = temp2;
}